

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::GetHandle<float,float,float>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,_func_float_float_float *f)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (jsonrpccxx *)0x0;
  local_28._8_8_ = 0;
  if (this != (jsonrpccxx *)0x0) {
    pcStack_10 = std::_Function_handler<float_(float,_float),_float_(*)(float,_float)>::_M_invoke;
    local_18 = std::_Function_handler<float_(float,_float),_float_(*)(float,_float)>::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)this;
  }
  GetHandle<float,float,float>
            (__return_storage_ptr__,(jsonrpccxx *)local_28._M_pod_data,
             (function<float_(float,_float)> *)f);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (*f)(ParamTypes...)) {
    return GetHandle(std::function<ReturnType(ParamTypes...)>(f));
  }